

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc1.c
# Opt level: O1

uint8_t mbc1_read(gb_cart_t *cart,uint16_t addr)

{
  uint uVar1;
  uint8_t uVar2;
  int iVar3;
  uint8_t *puVar4;
  
  if (cart == (gb_cart_t *)0x0) {
    __assert_fail("cart != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc1.c"
                  ,0x2f,"uint8_t mbc1_read(gb_cart_t *, uint16_t)");
  }
  uVar1 = (uint)(addr >> 0xc);
  uVar2 = 0xff;
  if (uVar1 < 0xc) {
    if ((0xfU >> uVar1 & 1) == 0) {
      if ((0xf0U >> uVar1 & 1) == 0) {
        if ((0xc00U >> uVar1 & 1) == 0) {
          return 0xff;
        }
        if (*cart->mbc_state != '\x01') {
          return 0xff;
        }
        iVar3 = 0;
        if (*(char *)((long)cart->mbc_state + 1) == '\0') {
          iVar3 = cart->curr_ram_bank << 0xd;
        }
        puVar4 = cart->ram + (long)(int)(iVar3 + (uint)addr) + -0xa000;
      }
      else {
        puVar4 = cart->rom + (ulong)addr + (long)cart->curr_rom_bank * 0x4000 + -0x4000;
      }
    }
    else {
      puVar4 = cart->rom + addr;
    }
    uVar2 = *puVar4;
  }
  return uVar2;
}

Assistant:

uint8_t mbc1_read(gb_cart_t *cart, uint16_t addr)
{
    assert(cart != NULL);

    mbc1_state_t *state = (mbc1_state_t*)cart->mbc_state;

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
    case 0x2000:
    case 0x3000:
        // ROM bank 0 in mode 0
        return cart->rom[addr];

    case 0x4000:
    case 0x5000:
    case 0x6000:
    case 0x7000:
    {
        // Switchable ROM bank
        int offset = cart->curr_rom_bank * ROM_BANK_SIZE;
        return cart->rom[offset + addr - 0x4000];
    }
    
    case 0xA000:
    case 0xB000:
        // External RAM
        if (state->ram_enabled)
        {
            int offset = 0;
            if (!state->second_mode)
                offset = cart->curr_ram_bank * SRAM_BANK_SIZE;

            return cart->ram[offset + addr - 0xA000];
        }
        else
            return 0xFF;
    
    default:
        return 0xFF;
    }
}